

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O3

map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
* Dashel::SerialPortEnumerator::getPorts_abi_cxx11_(void)

{
  _Rb_tree_header *p_Var1;
  __dev_t __dev;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 uVar8;
  char *__file;
  long lVar9;
  char *__s;
  size_t sVar10;
  mapped_type *this;
  DashelException *pDVar11;
  map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_RDI;
  ostringstream oss;
  stat st;
  undefined1 auStack_2e8 [15];
  allocator<char> local_2d9;
  undefined8 local_2d8;
  int local_2cc;
  map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_2c8;
  int local_2bc;
  long *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8;
  undefined7 uStack_2a7;
  undefined8 uStack_2a0;
  long *local_298;
  undefined8 local_290;
  undefined1 local_288;
  undefined7 uStack_287;
  undefined8 uStack_280;
  long *local_278;
  undefined8 local_270;
  long local_268;
  undefined8 uStack_260;
  long *local_258;
  undefined8 local_250;
  long local_248;
  undefined8 uStack_240;
  long local_238 [14];
  ios_base local_1c8 [264];
  stat local_c0;
  
  p_Var1 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c8 = in_RDI;
  lVar5 = udev_new();
  if (lVar5 == 0) {
    pDVar11 = (DashelException *)__cxa_allocate_exception(0x20);
    DashelException::DashelException
              (pDVar11,EnumerationError,0,"Cannot create udev context",(Stream *)0x0);
    __cxa_throw(pDVar11,&DashelException::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar6 = udev_enumerate_new(lVar5);
  udev_enumerate_add_match_subsystem(uVar6,"tty");
  udev_enumerate_scan_devices(uVar6);
  lVar7 = udev_enumerate_get_list_entry(uVar6);
  local_2cc = 0;
  do {
    if (lVar7 == 0) {
      udev_enumerate_unref(uVar6);
      udev_unref(lVar5);
      return local_2c8;
    }
    uVar8 = udev_list_entry_get_name(lVar7);
    uVar8 = udev_device_new_from_syspath(lVar5,uVar8);
    __file = (char *)udev_device_get_devnode(uVar8);
    local_2d8 = uVar8;
    iVar2 = stat(__file,&local_c0);
    __dev = local_c0.st_rdev;
    if (iVar2 != 0) {
      pDVar11 = (DashelException *)__cxa_allocate_exception(0x20);
      DashelException::DashelException
                (pDVar11,EnumerationError,0,"Cannot stat serial port",(Stream *)0x0);
LAB_001118e7:
      __cxa_throw(pDVar11,&DashelException::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((local_c0.st_mode & 0xf000) != 0x2000) {
      pDVar11 = (DashelException *)__cxa_allocate_exception(0x20);
      DashelException::DashelException
                (pDVar11,EnumerationError,0,"Serial port is not character device",(Stream *)0x0);
      goto LAB_001118e7;
    }
    uVar3 = gnu_dev_major(local_c0.st_rdev);
    if ((((uVar3 != 2) && (uVar4 = gnu_dev_minor(__dev), uVar3 != 4 || 0x3f < uVar4)) &&
        (uVar3 != 3)) && (uVar3 != 5)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
      lVar9 = udev_device_get_parent_with_subsystem_devtype(local_2d8,"usb","usb_device");
      if (lVar9 == 0) {
        sVar10 = 0xb;
        __s = "Serial Port";
LAB_00111619:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,__s,sVar10);
      }
      else {
        __s = (char *)udev_device_get_sysattr_value(lVar9,"product");
        if (__s != (char *)0x0) {
          sVar10 = strlen(__s);
          goto LAB_00111619;
        }
        std::ios::clear((int)auStack_2e8 + (int)*(undefined8 *)(local_238[0] + -0x18) + 0xb0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238," (",2);
      if (__file == (char *)0x0) {
        std::ios::clear((int)auStack_2e8 + (int)*(undefined8 *)(local_238[0] + -0x18) + 0xb0);
      }
      else {
        sVar10 = strlen(__file);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,__file,sVar10);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,")",1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,__file,&local_2d9);
      std::__cxx11::stringbuf::str();
      local_278 = &local_268;
      if (local_298 == (long *)&local_288) {
        uStack_260 = uStack_280;
      }
      else {
        local_278 = local_298;
      }
      local_268 = CONCAT71(uStack_287,local_288);
      local_270 = local_290;
      local_290 = 0;
      local_288 = 0;
      local_258 = &local_248;
      if (local_2b8 == (long *)&local_2a8) {
        uStack_240 = uStack_2a0;
      }
      else {
        local_258 = local_2b8;
      }
      local_248 = CONCAT71(uStack_2a7,local_2a8);
      local_250 = local_2b0;
      local_2b0 = 0;
      local_2a8 = 0;
      local_2bc = local_2cc;
      local_2b8 = (long *)&local_2a8;
      local_298 = (long *)&local_288;
      this = std::
             map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](local_2c8,&local_2bc);
      std::__cxx11::string::operator=((string *)this,(string *)&local_278);
      std::__cxx11::string::operator=((string *)&this->second,(string *)&local_258);
      if (local_258 != &local_248) {
        operator_delete(local_258,local_248 + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if (local_2b8 != (long *)&local_2a8) {
        operator_delete(local_2b8,CONCAT71(uStack_2a7,local_2a8) + 1);
      }
      if (local_298 != (long *)&local_288) {
        operator_delete(local_298,CONCAT71(uStack_287,local_288) + 1);
      }
      local_2cc = local_2cc + 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
      std::ios_base::~ios_base(local_1c8);
    }
    udev_device_unref(local_2d8);
    lVar7 = udev_list_entry_get_next(lVar7);
  } while( true );
}

Assistant:

virtual bool isDataInRecvBuffer() const { return false; }